

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_device.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  EGLint EVar2;
  EGLBoolean EVar3;
  undefined1 *puVar4;
  EGLDisplay pvVar5;
  EGLSurface pvVar6;
  EGLContext pvVar7;
  GLubyte *pGVar8;
  int minor;
  int major;
  EGLint num_devices;
  EGLint egl_pbuffer_attribs [5];
  EGLint egl_config_attribs [13];
  EGLDeviceEXT egl_devices [32];
  EGLint local_194;
  EGLint local_190 [10];
  EGLint local_168 [16];
  EGLDeviceEXT local_128 [32];
  
  local_168[8] = 0x3033;
  local_168[9] = 1;
  local_168[10] = 0x3040;
  local_168[0xb] = 8;
  local_168[4] = 0x3022;
  local_168[5] = 8;
  local_168[6] = 0x3025;
  local_168[7] = 8;
  local_168[0] = 0x3024;
  local_168[1] = 8;
  local_168[2] = 0x3023;
  local_168[3] = 8;
  local_168[0xc] = 0x3038;
  local_190[2] = 0x3057;
  local_190[3] = 0x100;
  local_190[4] = 0x3056;
  local_190[5] = 0x100;
  local_190[6] = 0x3038;
  puVar4 = (undefined1 *)operator_new(0x38);
  *puVar4 = 0;
  *(undefined8 *)(puVar4 + 4) = 0;
  iVar1 = gladLoaderLoadEGL((EGLDisplay)0x0);
  if (iVar1 == 0) {
    main_cold_10();
LAB_0012b59a:
    main_cold_9();
LAB_0012b59f:
    main_cold_8();
LAB_0012b5a4:
    main_cold_7();
LAB_0012b5a9:
    main_cold_6();
LAB_0012b5ae:
    main_cold_1();
LAB_0012b5b3:
    main_cold_5();
LAB_0012b5b8:
    main_cold_4();
  }
  else {
    local_190[1] = 0;
    EVar2 = (*glad_eglGetError)();
    EVar3 = (*glad_eglQueryDevicesEXT)(0x20,local_128,local_190 + 1);
    if ((EVar3 == 0) || (EVar2 != 0x3000)) {
      puts("eglQueryDevicesEXT Failed.");
      *(undefined8 *)(puVar4 + 0x30) = 0;
    }
    iVar1 = atoi(argv[1]);
    *(int *)(puVar4 + 0xc) = iVar1;
    pvVar5 = (*glad_eglGetPlatformDisplayEXT)(0x313f,local_128[iVar1],(EGLint *)0x0);
    EVar2 = (*glad_eglGetError)();
    if ((EVar2 == 0x3000) && (pvVar5 != (EGLDisplay)0x0)) {
      EVar3 = (*glad_eglInitialize)(pvVar5,local_190,&local_194);
      EVar2 = (*glad_eglGetError)();
      if ((EVar2 == 0x3000) && (EVar3 == 1)) {
        *(EGLDisplay *)(puVar4 + 0x30) = pvVar5;
      }
    }
    EVar3 = (*glad_eglInitialize)(*(EGLDisplay *)(puVar4 + 0x30),(EGLint *)0x0,(EGLint *)0x0);
    if (EVar3 == 0) goto LAB_0012b59a;
    iVar1 = gladLoaderLoadEGL(*(EGLDisplay *)(puVar4 + 0x30));
    if (iVar1 == 0) goto LAB_0012b59f;
    printf("Loaded EGL %d.%d after reload.\n",(ulong)(uint)(iVar1 / 10000),
           (ulong)(uint)(iVar1 % 10000));
    EVar3 = (*glad_eglBindAPI)(0x30a2);
    *(EGLBoolean *)(puVar4 + 0x10) = EVar3;
    if (EVar3 == 0) goto LAB_0012b5a4;
    EVar3 = (*glad_eglChooseConfig)
                      (*(EGLDisplay *)(puVar4 + 0x30),local_168,(EGLConfig *)(puVar4 + 0x18),1,
                       (EGLint *)(puVar4 + 0x14));
    *(EGLBoolean *)(puVar4 + 0x10) = EVar3;
    if (EVar3 == 0) goto LAB_0012b5a9;
    if (*(int *)(puVar4 + 0x14) != 1) goto LAB_0012b5ae;
    pvVar6 = (*glad_eglCreatePbufferSurface)
                       (*(EGLDisplay *)(puVar4 + 0x30),*(EGLConfig *)(puVar4 + 0x18),local_190 + 2);
    *(EGLSurface *)(puVar4 + 0x20) = pvVar6;
    if (pvVar6 == (EGLSurface)0x0) goto LAB_0012b5b3;
    pvVar7 = (*glad_eglCreateContext)
                       (*(EGLDisplay *)(puVar4 + 0x30),*(EGLConfig *)(puVar4 + 0x18),(EGLContext)0x0
                        ,(EGLint *)0x0);
    *(EGLContext *)(puVar4 + 0x28) = pvVar7;
    if (pvVar7 == (EGLContext)0x0) goto LAB_0012b5b8;
    EVar3 = (*glad_eglMakeCurrent)
                      (*(EGLDisplay *)(puVar4 + 0x30),*(EGLSurface *)(puVar4 + 0x20),
                       *(EGLSurface *)(puVar4 + 0x20),pvVar7);
    *(EGLBoolean *)(puVar4 + 0x10) = EVar3;
    if (EVar3 != 0) {
      iVar1 = gladLoadGL((GLADloadfunc)glad_eglGetProcAddress);
      if (iVar1 != 0) {
        pGVar8 = (*glad_glGetString)(0x1f00);
        printf("GL_VENDOR=%s\n",pGVar8);
        pGVar8 = (*glad_glGetString)(0x1f01);
        printf("GL_RENDERER=%s\n",pGVar8);
        pGVar8 = (*glad_glGetString)(0x1f02);
        printf("GL_VERSION=%s\n",pGVar8);
        pGVar8 = (*glad_glGetString)(0x8b8c);
        printf("GL_SHADING_LANGUAGE_VERSION=%s\n",pGVar8);
        return 0;
      }
      goto LAB_0012b5c2;
    }
  }
  main_cold_3();
LAB_0012b5c2:
  main_cold_2();
  halt_baddata();
}

Assistant:

int main(int argc, char ** argv){


    int m_windowWidth;
    int m_windowHeight;
    int m_renderDevice;
    
    EGLBoolean success;
    EGLint num_configs;
    EGLConfig egl_config;
    EGLSurface egl_surface;
    EGLContext egl_context;
    EGLDisplay egl_display;
    
    m_windowWidth = 256;
    m_windowHeight = 256;
    m_renderDevice = -1;

    EGLint egl_config_attribs[] = {EGL_RED_SIZE,
        8,
        EGL_GREEN_SIZE,
        8,
        EGL_BLUE_SIZE,
        8,
        EGL_DEPTH_SIZE,
        8,
        EGL_SURFACE_TYPE,
        EGL_PBUFFER_BIT,
        EGL_RENDERABLE_TYPE,
        EGL_OPENGL_BIT,
        EGL_NONE};
    
    EGLint egl_pbuffer_attribs[] = {
        EGL_WIDTH, m_windowWidth, EGL_HEIGHT, m_windowHeight,
        EGL_NONE,
    };
    
    EGLInternalData2* m_data = new EGLInternalData2();

    // Load EGL functions
    int egl_version = gladLoaderLoadEGL(NULL);
    if(!egl_version) {
        fprintf(stderr, "failed to EGL with glad.\n");
        exit(EXIT_FAILURE);

    };

    // Query EGL Devices
    const int max_devices = 32;
    EGLDeviceEXT egl_devices[max_devices];
    EGLint num_devices = 0;
    EGLint egl_error = eglGetError();
    if (!eglQueryDevicesEXT(max_devices, egl_devices, &num_devices) ||
        egl_error != EGL_SUCCESS) {
        printf("eglQueryDevicesEXT Failed.\n");
        m_data->egl_display = EGL_NO_DISPLAY;
    }

    //printf("number of devices found %d\n", num_devices);

    
    m_data->m_renderDevice = atoi(argv[1]);

        // Set display
        EGLDisplay display = eglGetPlatformDisplayEXT(EGL_PLATFORM_DEVICE_EXT,
                                                      egl_devices[m_data->m_renderDevice], NULL);
        if (eglGetError() == EGL_SUCCESS && display != EGL_NO_DISPLAY) {
            int major, minor;
            EGLBoolean initialized = eglInitialize(display, &major, &minor);
            if (eglGetError() == EGL_SUCCESS && initialized == EGL_TRUE) {
                m_data->egl_display = display;
            }
        }

    if (!eglInitialize(m_data->egl_display, NULL, NULL)) {
        fprintf(stderr, "Unable to initialize EGL\n");
        exit(EXIT_FAILURE);
    }

    egl_version = gladLoaderLoadEGL(m_data->egl_display);
    if (!egl_version) {
        fprintf(stderr, "Unable to reload EGL.\n");
        exit(EXIT_FAILURE);
    }
    printf("Loaded EGL %d.%d after reload.\n", GLAD_VERSION_MAJOR(egl_version),
           GLAD_VERSION_MINOR(egl_version));


    m_data->success = eglBindAPI(EGL_OPENGL_API);
    if (!m_data->success) {
        // TODO: Properly handle this error (requires change to default window
        // API to change return on all window types to bool).
        fprintf(stderr, "Failed to bind OpenGL API.\n");
        exit(EXIT_FAILURE);
    }

    m_data->success =
    eglChooseConfig(m_data->egl_display, egl_config_attribs,
                    &m_data->egl_config, 1, &m_data->num_configs);
    if (!m_data->success) {
        // TODO: Properly handle this error (requires change to default window
        // API to change return on all window types to bool).
        fprintf(stderr, "Failed to choose config (eglError: %d)\n", eglGetError());
        exit(EXIT_FAILURE);
    }
    if (m_data->num_configs != 1) {
        fprintf(stderr, "Didn't get exactly one config, but %d\n", m_data->num_configs);
        exit(EXIT_FAILURE);
    }

    m_data->egl_surface = eglCreatePbufferSurface(
                                                  m_data->egl_display, m_data->egl_config, egl_pbuffer_attribs);
    if (m_data->egl_surface == EGL_NO_SURFACE) {
        fprintf(stderr, "Unable to create EGL surface (eglError: %d)\n", eglGetError());
        exit(EXIT_FAILURE);
    }


    m_data->egl_context = eglCreateContext(
                                           m_data->egl_display, m_data->egl_config, EGL_NO_CONTEXT, NULL);
    if (!m_data->egl_context) {
        fprintf(stderr, "Unable to create EGL context (eglError: %d)\n",eglGetError());
        exit(EXIT_FAILURE);
    }

    m_data->success =
        eglMakeCurrent(m_data->egl_display, m_data->egl_surface, m_data->egl_surface,
                   m_data->egl_context);
    if (!m_data->success) {
        fprintf(stderr, "Failed to make context current (eglError: %d)\n", eglGetError());
        exit(EXIT_FAILURE);
    }

    if (!gladLoadGL(eglGetProcAddress)) {
        fprintf(stderr, "failed to load GL with glad.\n");
        exit(EXIT_FAILURE);
    }

    const GLubyte* ven = glGetString(GL_VENDOR);
    printf("GL_VENDOR=%s\n", ven);

    const GLubyte* ren = glGetString(GL_RENDERER);
    printf("GL_RENDERER=%s\n", ren);
    const GLubyte* ver = glGetString(GL_VERSION);
    printf("GL_VERSION=%s\n", ver);
    const GLubyte* sl = glGetString(GL_SHADING_LANGUAGE_VERSION);
    printf("GL_SHADING_LANGUAGE_VERSION=%s\n", sl);

    return 0;
}